

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

uint64_t __thiscall flexbuffers::Reference::AsUInt64(Reference *this)

{
  uint8_t *data;
  uint64_t uVar1;
  uint64_t *puVar2;
  byte bVar3;
  uint8_t byte_width;
  double dVar4;
  Vector local_28;
  
  uVar1 = 0;
  switch(this->type_) {
  case FBT_INT:
    puVar2 = (uint64_t *)this->data_;
    bVar3 = this->parent_width_;
    goto LAB_0013d6ed;
  case FBT_FLOAT:
    data = this->data_;
    byte_width = this->parent_width_;
    goto LAB_0013d6bc;
  case FBT_KEY:
  case FBT_MAP:
    break;
  case FBT_STRING:
    AsString((String *)&local_28,this);
    uVar1 = flatbuffers::StringToUInt((char *)local_28.super_Sized.super_Object.data_,10);
    break;
  case FBT_INDIRECT_INT:
    puVar2 = (uint64_t *)Indirect(this);
    bVar3 = this->byte_width_;
LAB_0013d6ed:
    if (bVar3 < 4) {
      if (bVar3 < 2) {
        uVar1 = (uint64_t)(char)(byte)*puVar2;
      }
      else {
        uVar1 = (uint64_t)(short)(ushort)*puVar2;
      }
    }
    else if (bVar3 < 8) {
      uVar1 = (uint64_t)(int)(uint)*puVar2;
    }
    else {
LAB_0013d745:
      uVar1 = *puVar2;
    }
    break;
  case FBT_INDIRECT_UINT:
    puVar2 = (uint64_t *)Indirect(this);
    bVar3 = this->byte_width_;
LAB_0013d72d:
    if (bVar3 < 4) {
      if (bVar3 < 2) {
        return (ulong)(byte)*puVar2;
      }
      return (ulong)(ushort)*puVar2;
    }
    if (bVar3 < 8) {
      return (ulong)(uint)*puVar2;
    }
    goto LAB_0013d745;
  case FBT_INDIRECT_FLOAT:
    data = Indirect(this);
    byte_width = this->byte_width_;
LAB_0013d6bc:
    dVar4 = ReadSizedScalar<double,signed_char,short,float,double>(data,byte_width);
    uVar1 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    break;
  case FBT_VECTOR:
    AsVector(&local_28,this);
    uVar1 = local_28.super_Sized.size_;
    break;
  default:
    if (this->type_ != FBT_BOOL) {
      return 0;
    }
  case FBT_UINT:
    puVar2 = (uint64_t *)this->data_;
    bVar3 = this->parent_width_;
    goto LAB_0013d72d;
  }
  return uVar1;
}

Assistant:

uint64_t AsUInt64() const {
    if (type_ == FBT_UINT) {
      // A fast path for the common case.
      return ReadUInt64(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_UINT: return ReadUInt64(Indirect(), byte_width_);
        case FBT_INT: return ReadInt64(data_, parent_width_);
        case FBT_INDIRECT_INT: return ReadInt64(Indirect(), byte_width_);
        case FBT_FLOAT:
          return static_cast<uint64_t>(ReadDouble(data_, parent_width_));
        case FBT_INDIRECT_FLOAT:
          return static_cast<uint64_t>(ReadDouble(Indirect(), byte_width_));
        case FBT_NULL: return 0;
        case FBT_STRING: return flatbuffers::StringToUInt(AsString().c_str());
        case FBT_VECTOR: return static_cast<uint64_t>(AsVector().size());
        case FBT_BOOL: return ReadUInt64(data_, parent_width_);
        default:
          // Convert other things to uint.
          return 0;
      }
  }